

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataTypeRegister.cpp
# Opt level: O2

bool __thiscall
Rml::TransformFuncRegister::Call
          (TransformFuncRegister *this,String *name,VariantList *arguments,Variant *out_result)

{
  NodePtr pDVar1;
  code *pcVar2;
  bool bVar3;
  NodePtr pDVar4;
  const_iterator cVar5;
  Variant local_50;
  
  cVar5 = robin_hood::detail::
          Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&this->transform_functions,name);
  pDVar4 = cVar5.mKeyVals;
  pDVar1 = (NodePtr)(this->transform_functions).mInfo;
  if (pDVar4 != pDVar1) {
    if ((pDVar4->mData).second.super__Function_base._M_manager == (_Manager_type)0x0) {
      bVar3 = Assert("RMLUI_ASSERT(transform_func)",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/DataTypeRegister.cpp"
                     ,0x7d);
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
    }
    ::std::function<Rml::Variant_(const_std::vector<Rml::Variant,_std::allocator<Rml::Variant>_>_&)>
    ::operator()(&local_50,&(pDVar4->mData).second,arguments);
    Variant::operator=(out_result,&local_50);
    Variant::~Variant(&local_50);
  }
  return pDVar4 != pDVar1;
}

Assistant:

bool TransformFuncRegister::Call(const String& name, const VariantList& arguments, Variant& out_result) const
{
	auto it = transform_functions.find(name);
	if (it == transform_functions.end())
		return false;

	const DataTransformFunc& transform_func = it->second;
	RMLUI_ASSERT(transform_func);

	out_result = transform_func(arguments);
	return true;
}